

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::ShaderTextureFunctionCase::init
          (ShaderTextureFunctionCase *this,EVP_PKEY_CTX *ctx)

{
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  undefined1 *puVar3;
  NotSupportedError *this_01;
  int row;
  undefined8 *puVar4;
  long lVar5;
  EVP_PKEY_CTX *ctx_00;
  EVP_PKEY_CTX *__args;
  Vec4 s;
  int numVertexUnits;
  float baseCoordTrans [16];
  float afStack_1f4 [77];
  undefined1 *puStack_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [4];
  float fStack_64;
  undefined4 uStack_60;
  float fStack_5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined8 local_48;
  long lStack_40;
  undefined8 local_38;
  long lStack_30;
  
  if ((this->super_ShaderRenderCase).m_isVertexCase == true) {
    puStack_c0 = (undefined1 *)0x3371f3;
    iVar1 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
    local_a8 = (ulong)local_a8._4_4_ << 0x20;
    puStack_c0 = (undefined1 *)0x33720d;
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8b4c);
    if ((int)local_a8 < 1) {
      puStack_c0 = (undefined1 *)0x33741c;
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      _local_68 = (pointer)&local_58;
      puStack_c0 = (undefined1 *)0x337440;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"Vertex shader texture access is not supported","");
      puStack_c0 = (undefined1 *)0x337450;
      tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_68);
      puStack_c0 = &LAB_00337468;
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_b8 = 0;
  uStack_b0 = 0;
  lVar2 = 0x4f;
  do {
    afStack_1f4[lVar2] =
         *(float *)((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestNode.
                           _vptr_TestNode + lVar2 * 4) - *(float *)((long)this + lVar2 * 4 + -0x10);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x53);
  puVar3 = local_68;
  local_68 = (undefined1  [4])(float)local_b8;
  fStack_64 = 0.0;
  uStack_60 = 0;
  fStack_5c = (this->m_lookupSpec).minCoord.m_data[0];
  lVar2 = 0;
  local_58._M_allocated_capacity = local_b8 & 0xffffffff00000000;
  local_58._8_8_ = (ulong)(uint)(this->m_lookupSpec).minCoord.m_data[1] << 0x20;
  local_48 = CONCAT44((float)uStack_b0 * -0.5,(float)uStack_b0 * 0.5);
  lStack_40 = (ulong)(uint)((this->m_lookupSpec).minCoord.m_data[2] + (float)uStack_b0 * 0.5) <<
              0x20;
  local_38 = CONCAT44(uStack_b0._4_4_ * 0.5,uStack_b0._4_4_ * -0.5);
  lStack_30 = (ulong)(uint)(uStack_b0._4_4_ * 0.5 + (this->m_lookupSpec).minCoord.m_data[3]) << 0x20
  ;
  puVar4 = &local_a8;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)puVar4 + lVar5 * 4) = *(undefined4 *)(puVar3 + lVar5);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    lVar2 = lVar2 + 1;
    puVar3 = puVar3 + 0x10;
    puVar4 = (undefined8 *)((long)puVar4 + 4);
  } while (lVar2 != 4);
  this_00 = &(this->super_ShaderRenderCase).m_userAttribTransforms;
  __args = (EVP_PKEY_CTX *)&local_a8;
  puStack_c0 = (undefined1 *)0x337345;
  ctx_00 = __args;
  std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
  emplace_back<tcu::Matrix<float,4,4>>
            ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
             (Matrix<float,_4,_4> *)__args);
  if (((this->m_lookupSpec).function - FUNCTION_TEXTURELOD < 3) ||
     ((this->m_lookupSpec).useBias == true)) {
    fStack_5c = (this->m_lookupSpec).minLodBias;
    puVar3 = local_68;
    uStack_60 = 0;
    local_38 = 0;
    lStack_30 = 0;
    local_48 = 0;
    lStack_40 = 0;
    local_58._M_allocated_capacity = 0;
    local_58._8_8_ = 0;
    local_68 = (undefined1  [4])(((this->m_lookupSpec).maxLodBias - fStack_5c) * 0.5);
    fStack_64 = (float)local_68;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    lVar2 = 0;
    do {
      lVar5 = 0;
      do {
        *(undefined4 *)(__args + lVar5 * 4) = *(undefined4 *)(puVar3 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar2 = lVar2 + 1;
      puVar3 = puVar3 + 0x10;
      __args = __args + 4;
    } while (lVar2 != 4);
    ctx_00 = (EVP_PKEY_CTX *)&local_a8;
    puStack_c0 = (undefined1 *)0x3373ec;
    std::vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>>::
    emplace_back<tcu::Matrix<float,4,4>>
              ((vector<tcu::Matrix<float,4,4>,std::allocator<tcu::Matrix<float,4,4>>> *)this_00,
               (Matrix<float,_4,_4> *)ctx_00);
  }
  puStack_c0 = (undefined1 *)0x3373f4;
  initShaderSources(this);
  puStack_c0 = (undefined1 *)0x3373fc;
  initTexture(this);
  puStack_c0 = (undefined1 *)0x337404;
  iVar1 = deqp::gls::ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx_00);
  return iVar1;
}

Assistant:

void ShaderTextureFunctionCase::init (void)
{
	if (m_isVertexCase)
	{
		const glw::Functions& gl = m_renderCtx.getFunctions();
		int numVertexUnits = 0;
		gl.getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &numVertexUnits);
		if (numVertexUnits < 1)
			throw tcu::NotSupportedError("Vertex shader texture access is not supported");
	}

	{
		// Base coord scale & bias
		Vec4 s = m_lookupSpec.maxCoord-m_lookupSpec.minCoord;
		Vec4 b = m_lookupSpec.minCoord;

		float baseCoordTrans[] =
		{
			s.x(),		0.0f,		0.f,	b.x(),
			0.f,		s.y(),		0.f,	b.y(),
			s.z()/2.f,	-s.z()/2.f,	0.f,	s.z()/2.f + b.z(),
			-s.w()/2.f,	s.w()/2.f,	0.f,	s.w()/2.f + b.w()
		};

		m_userAttribTransforms.push_back(tcu::Mat4(baseCoordTrans));
	}

	if (functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias)
	{
		float s = m_lookupSpec.maxLodBias-m_lookupSpec.minLodBias;
		float b = m_lookupSpec.minLodBias;
		float lodCoordTrans[] =
		{
			s/2.0f,		s/2.0f,		0.f,	b,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(lodCoordTrans));
	}

	initShaderSources();
	initTexture();

	gls::ShaderRenderCase::init();
}